

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# penguinv.cpp
# Opt level: O0

void penguinV::Merge(Image *in1,uint32_t startXIn1,uint32_t startYIn1,Image *in2,uint32_t startXIn2,
                    uint32_t startYIn2,Image *in3,uint32_t startXIn3,uint32_t startYIn3,Image *out,
                    uint32_t startXOut,uint32_t startYOut,uint32_t width,uint32_t height)

{
  bool bVar1;
  FunctionTableHolder *pFVar2;
  reference puVar3;
  Image *in_RCX;
  uint32_t in_EDX;
  uint32_t in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  uint32_t in_R8D;
  uint32_t in_R9D;
  Image *in_stack_00000008;
  uint32_t in_stack_00000010;
  uint32_t in_stack_00000018;
  Image *in_stack_00000020;
  uint32_t in_stack_00000028;
  uint32_t in_stack_00000030;
  uint32_t in_stack_00000038;
  uint32_t in_stack_00000040;
  ImageManager manager;
  MergeForm4 funcTemp;
  const_iterator type;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *types;
  uint8_t imageType;
  MergeForm4 func;
  ImageTypeManager *registrator;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe78;
  uint8_t requiredType;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffeb4;
  ImageTypeManager *in_stack_fffffffffffffeb8;
  ImageTypeManager *in_stack_fffffffffffffec0;
  const_iterator in_stack_ffffffffffffff68;
  const_iterator in_stack_ffffffffffffff70;
  undefined1 local_88 [24];
  undefined1 *local_70;
  uint8_t local_61;
  MergeForm4 local_60;
  ImageTypeManager *local_58;
  uint32_t local_50;
  uint32_t local_4c;
  Image *local_48;
  uint32_t local_40;
  uint32_t local_3c;
  ImageTemplate<unsigned_char> *local_38;
  
  local_50 = in_R9D;
  local_4c = in_R8D;
  local_48 = in_RCX;
  local_40 = in_EDX;
  local_3c = in_ESI;
  local_38 = in_RDI;
  local_58 = ImageTypeManager::instance();
  PenguinV_Image::ImageTemplate<unsigned_char>::type(local_38);
  pFVar2 = ImageTypeManager::functionTable
                     (in_stack_fffffffffffffec0,(uint8_t)((ulong)in_stack_fffffffffffffeb8 >> 0x38))
  ;
  local_60 = pFVar2->Merge;
  local_61 = PenguinV_Image::ImageTemplate<unsigned_char>::type(local_38);
  if ((local_60 == (MergeForm4)0x0) &&
     (bVar1 = ImageTypeManager::isIntertypeConversionEnabled(local_58), bVar1)) {
    ImageTypeManager::imageTypes(in_stack_fffffffffffffeb8);
    local_70 = local_88;
    in_stack_ffffffffffffff70 =
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cbegin
                   (in_stack_fffffffffffffe78);
    while( true ) {
      in_stack_ffffffffffffff68 =
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::cend
                     (in_stack_fffffffffffffe78);
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                         (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          *)in_stack_fffffffffffffe78);
      if (!bVar1) break;
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator*((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&stack0xffffffffffffff70);
      pFVar2 = ImageTypeManager::functionTable
                         (in_stack_fffffffffffffec0,
                          (uint8_t)((ulong)in_stack_fffffffffffffeb8 >> 0x38));
      if (pFVar2->Merge != (MergeForm4)0x0) {
        local_60 = pFVar2->Merge;
        puVar3 = __gnu_cxx::
                 __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::operator*((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                              *)&stack0xffffffffffffff70);
        local_61 = *puVar3;
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator++((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    *)&stack0xffffffffffffff70);
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_fffffffffffffe90);
  }
  requiredType = (uint8_t)((ulong)in_stack_fffffffffffffe78 >> 0x38);
  (anonymous_namespace)::
  verifyFunction<void(*)(PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>const&,unsigned_int,unsigned_int,PenguinV_Image::ImageTemplate<unsigned_char>&,unsigned_int,unsigned_int,unsigned_int,unsigned_int)>
            ((_func_void_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_ImageTemplate<unsigned_char>_ptr_uint_uint_uint_uint
              *)in_stack_ffffffffffffff70._M_current,(char *)in_stack_ffffffffffffff68._M_current);
  anon_unknown.dwarf_353bb::ImageManager::ImageManager
            ((ImageManager *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
             requiredType);
  (*local_60)(local_38,local_3c,local_40,local_48,local_4c,local_50,in_stack_00000008,
              in_stack_00000010,in_stack_00000018,in_stack_00000020,in_stack_00000028,
              in_stack_00000030,in_stack_00000038,in_stack_00000040);
  anon_unknown.dwarf_353bb::ImageManager::~ImageManager
            ((ImageManager *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_00000040));
  return;
}

Assistant:

void Merge( const Image & in1, uint32_t startXIn1, uint32_t startYIn1, const Image & in2, uint32_t startXIn2, uint32_t startYIn2,
                const Image & in3, uint32_t startXIn3, uint32_t startYIn3, Image & out, uint32_t startXOut, uint32_t startYOut,
                uint32_t width, uint32_t height )
    {
        initialize( in1, Merge )
        func( in1, startXIn1, startYIn1, in2, startXIn2, startYIn2, in3, startXIn3, startYIn3,
                           out, startXOut, startYOut, width, height );
    }